

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

AllocatedBlock * __thiscall ctemplate::BaseArena::AllocNewBlock(BaseArena *this,size_t block_size)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  pointer pAVar2;
  BaseArena *this_00;
  _func_int **pp_Var3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  uint uVar7;
  size_t __new_size;
  char *pcVar8;
  undefined8 in_R9;
  AllocatedBlock *pAVar9;
  
  uVar7 = this->blocks_alloced_;
  if ((ulong)uVar7 < 0x10) {
    this->blocks_alloced_ = uVar7 + 1;
    pAVar9 = this->first_blocks_ + uVar7;
    __new_size = block_size;
    this_00 = this;
  }
  else {
    this_00 = (BaseArena *)this->overflow_blocks_;
    if (this_00 == (BaseArena *)0x0) {
      this_00 = (BaseArena *)operator_new(0x18);
      this_00->remaining_ = 0;
      this_00->_vptr_BaseArena = (_func_int **)0x0;
      (this_00->status_).bytes_allocated_ = 0;
      this->overflow_blocks_ =
           (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
            *)this_00;
      pp_Var3 = (_func_int **)0x0;
    }
    else {
      pp_Var3 = this_00->_vptr_BaseArena;
    }
    __new_size = ((long)((this_00->status_).bytes_allocated_ - (long)pp_Var3) >> 4) + 1;
    std::
    vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
    ::resize((vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
              *)this_00,__new_size);
    pAVar9 = (this->overflow_blocks_->
             super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  if (this->page_aligned_ == true) {
    pvVar5 = aligned_malloc((size_t)this_00,__new_size);
    if ((uint)__new_size < 0x10) {
      return this_00->first_blocks_ + (__new_size & 0xffffffff);
    }
    pvVar1 = this_00->overflow_blocks_;
    if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                   *)0x0) {
      fprintf(_stderr,"Check failed: %s\n","overflow_blocks_ != NULL");
    }
    else {
      uVar7 = (uint)__new_size - 0x10;
      if ((int)uVar7 < 0) {
        pcVar6 = "index_in_overflow_blocks";
        pcVar4 = ">=";
        pcVar8 = "0";
      }
      else {
        pAVar2 = (pvVar1->
                 super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar7 <
            (ulong)((long)(pvVar1->
                          super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4)) {
          return pAVar2 + uVar7;
        }
        pcVar6 = "static_cast<size_t>(index_in_overflow_blocks)";
        pcVar4 = "<";
        pcVar8 = "overflow_blocks_->size()";
      }
      fprintf(_stderr,"Check failed: %s %s %s\n",pcVar6,pcVar4,pcVar8,in_R9,pvVar5);
    }
    exit(1);
  }
  pcVar4 = (char *)malloc(block_size);
  pAVar9->mem = pcVar4;
  pAVar9->size = block_size;
  (this->status_).bytes_allocated_ = (this->status_).bytes_allocated_ + block_size;
  return pAVar9;
}

Assistant:

BaseArena::AllocatedBlock*  BaseArena::AllocNewBlock(const size_t block_size) {
  AllocatedBlock *block;
  // Find the next block.
  if ( blocks_alloced_ < ARRAYSIZE(first_blocks_) ) {
    // Use one of the pre-allocated blocks
    block = &first_blocks_[blocks_alloced_++];
  } else {                   // oops, out of space, move to the vector
    if (overflow_blocks_ == NULL) overflow_blocks_ = new vector<AllocatedBlock>;
    // Adds another block to the vector.
    overflow_blocks_->resize(overflow_blocks_->size()+1);
    // block points to the last block of the vector.
    block = &overflow_blocks_->back();
  }

  if (page_aligned_) {
    // We need the size to be multiple of kPageSize to mprotect it later.
    size_t num_pages = ((block_size - 1) / kPageSize) + 1;
    size_t new_block_size = num_pages * kPageSize;
    block->mem = reinterpret_cast<char*>(aligned_malloc(new_block_size,
                                                        kPageSize));
    PCHECK(NULL != block->mem);
    block->size = new_block_size;
  } else {
    block->mem = reinterpret_cast<char*>(malloc(block_size));
    block->size = block_size;
  }

  ARENASET(status_.bytes_allocated_ += block_size);

  return block;
}